

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

void us_socket_context_on_end
               (int ssl,us_socket_context_t *context,_func_us_socket_t_ptr_us_socket_t_ptr *on_end)

{
  if (ssl != 0) {
    us_internal_ssl_socket_context_on_end
              ((us_internal_ssl_socket_context_t *)context,
               (_func_us_internal_ssl_socket_t_ptr_us_internal_ssl_socket_t_ptr *)on_end);
    return;
  }
  context->on_end = on_end;
  return;
}

Assistant:

void us_socket_context_on_end(int ssl, struct us_socket_context_t *context, struct us_socket_t *(*on_end)(struct us_socket_t *)) {
#ifndef LIBUS_NO_SSL
    if (ssl) {
        us_internal_ssl_socket_context_on_end((struct us_internal_ssl_socket_context_t *) context, (struct us_internal_ssl_socket_t * (*)(struct us_internal_ssl_socket_t *)) on_end);
        return;
    }
#endif

    context->on_end = on_end;
}